

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gridsample_bilinear_compute_blob.h
# Opt level: O0

void ncnn::gridsample_3d_bilinear_compute_blob<(ncnn::GridSample::PaddingMode)1,false>
               (Mat *src,Mat *grid,Mat *offset_value,int permute_fusion)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  bool bVar11;
  bool bVar12;
  uint uVar13;
  uint uVar14;
  uint uVar15;
  uint uVar16;
  uint uVar17;
  uint uVar18;
  int in_ECX;
  long *in_RDX;
  long *in_RSI;
  long in_RDI;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float *value_ptr_1;
  int *offset_ptr_1;
  bool in_bound_111_1;
  bool in_bound_110_1;
  bool in_bound_101_1;
  bool in_bound_100_1;
  bool in_bound_011_1;
  bool in_bound_010_1;
  bool in_bound_001_1;
  bool in_bound_000_1;
  bool v11_in_range_1;
  bool v10_in_range_1;
  bool v01_in_range_1;
  bool v00_in_range_1;
  bool z1_in_range_1;
  bool y1_in_range_1;
  bool x1_in_range_1;
  bool z0_in_range_1;
  bool y0_in_range_1;
  bool x0_in_range_1;
  int z1_1;
  int y1_1;
  int x1_1;
  int z0_1;
  int y0_1;
  int x0_1;
  float sample_z_1;
  float sample_y_1;
  float sample_x_1;
  int x_1;
  float *gridptr_z;
  float *gridptr_y;
  float *gridptr_x;
  float *value_ptr;
  int *offset_ptr;
  bool in_bound_111;
  bool in_bound_110;
  bool in_bound_101;
  bool in_bound_100;
  bool in_bound_011;
  bool in_bound_010;
  bool in_bound_001;
  bool in_bound_000;
  bool v11_in_range;
  bool v10_in_range;
  bool v01_in_range;
  bool v00_in_range;
  bool z1_in_range;
  bool y1_in_range;
  bool x1_in_range;
  bool z0_in_range;
  bool y0_in_range;
  bool x0_in_range;
  int z1;
  int y1;
  int x1;
  int z0;
  int y0;
  int x0;
  float sample_z;
  float sample_y;
  float sample_x;
  int x;
  float *gridptr;
  int y;
  compute_coord<(ncnn::GridSample::PaddingMode)1,_false> get_coord;
  grid_sample_unormalize<false> unormalize;
  float *offset_value_ptr;
  int grid_size;
  Mat *m_4;
  Mat *m_3;
  Mat *m_2;
  Mat *m_1;
  Mat *m;
  double local_6e8;
  double local_6e0;
  double local_6d8;
  double local_6d0;
  double local_6c8;
  double local_6c0;
  double local_6b8;
  double local_6b0;
  double local_630;
  double local_628;
  double local_620;
  double local_618;
  double local_610;
  double local_608;
  double local_600;
  double local_5f8;
  int local_554;
  undefined8 local_550;
  undefined8 local_548;
  undefined8 local_540;
  undefined4 local_538;
  long local_530;
  undefined4 local_528;
  undefined4 local_524;
  undefined4 local_520;
  undefined4 local_51c;
  undefined4 local_518;
  undefined8 local_510;
  float *local_508;
  undefined8 local_500;
  undefined8 local_4f8;
  undefined8 local_4f0;
  undefined4 local_4e8;
  long local_4e0;
  undefined4 local_4d8;
  undefined4 local_4d4;
  undefined4 local_4d0;
  undefined4 local_4cc;
  undefined4 local_4c8;
  undefined8 local_4c0;
  float *local_4b8;
  undefined8 local_4b0;
  undefined8 local_4a8;
  undefined8 local_4a0;
  undefined4 local_498;
  long local_490;
  undefined4 local_488;
  undefined4 local_484;
  undefined4 local_480;
  undefined4 local_47c;
  undefined4 local_478;
  undefined8 local_470;
  float *local_468;
  float *local_460;
  int *local_458;
  undefined1 local_44a;
  undefined1 local_449;
  undefined1 local_448;
  undefined1 local_447;
  undefined1 local_446;
  undefined1 local_445;
  undefined1 local_444;
  undefined1 local_443;
  undefined1 local_442;
  undefined1 local_441;
  undefined1 local_440;
  undefined1 local_43f;
  undefined1 local_43e;
  undefined1 local_43d;
  undefined1 local_43c;
  undefined1 local_43b;
  undefined1 local_43a;
  undefined1 local_439;
  uint local_438;
  uint local_434;
  uint local_430;
  uint local_42c;
  uint local_428;
  uint local_424;
  float local_420;
  float local_41c;
  float local_418;
  int local_414;
  undefined8 local_410;
  undefined8 local_408;
  undefined8 local_400;
  undefined4 local_3f8;
  long local_3f0;
  undefined4 local_3e8;
  undefined4 local_3e4;
  undefined4 local_3e0;
  undefined4 local_3dc;
  undefined4 local_3d8;
  undefined8 local_3d0;
  float *local_3c8;
  int local_3c0;
  compute_coord<(ncnn::GridSample::PaddingMode)1,_false> local_3ba;
  grid_sample_unormalize<false> local_3b9;
  undefined8 local_3b8;
  undefined8 local_3b0;
  undefined8 local_3a8;
  undefined4 local_3a0;
  long local_398;
  undefined4 local_390;
  undefined4 local_38c;
  undefined4 local_388;
  undefined4 local_384;
  undefined4 local_380;
  undefined8 local_378;
  int *local_370;
  int local_368;
  long *local_358;
  long local_350;
  undefined8 *local_348;
  undefined8 *local_340;
  undefined8 *local_338;
  undefined8 *local_330;
  undefined8 *local_328;
  undefined8 *local_318;
  undefined8 *local_308;
  undefined8 *local_2f8;
  undefined8 *local_2e8;
  undefined8 *local_2d8;
  undefined1 local_2a5;
  undefined4 local_2a4;
  undefined8 *local_298;
  undefined1 local_26d;
  undefined4 local_26c;
  undefined8 *local_260;
  undefined1 local_235;
  undefined4 local_234;
  undefined8 *local_228;
  undefined1 local_1fd;
  int local_1fc;
  undefined8 *local_1f0;
  undefined8 *local_1c8;
  undefined8 *local_1c0;
  undefined8 *local_1b8;
  undefined8 *local_1b0;
  undefined1 local_1a5;
  undefined4 local_1a4;
  undefined8 *local_198;
  undefined8 *local_170;
  long local_168;
  undefined4 local_15c;
  long local_158;
  int *local_150;
  undefined4 local_144;
  int local_140;
  int local_13c;
  undefined8 *local_138;
  long local_130;
  undefined4 local_124;
  long local_120;
  float *local_118;
  undefined4 local_10c;
  int local_108;
  int local_104;
  undefined8 *local_100;
  long local_f8;
  undefined4 local_ec;
  long local_e8;
  float *local_e0;
  undefined4 local_d4;
  int local_d0;
  int local_cc;
  undefined8 *local_c8;
  long local_c0;
  undefined4 local_b4;
  long local_b0;
  float *local_a8;
  undefined4 local_9c;
  int local_98;
  int local_94;
  undefined8 *local_90;
  long local_88;
  undefined4 local_7c;
  long local_78;
  float *local_70;
  undefined4 local_64;
  int local_60;
  int local_5c;
  undefined8 *local_58;
  undefined4 local_4c;
  long local_48;
  undefined4 local_3c;
  long local_38;
  undefined4 local_2c;
  long local_28;
  undefined4 local_1c;
  long local_18;
  undefined4 local_c;
  long local_8;
  
  local_368 = *(int *)((long)in_RSI + 0x2c) * (int)in_RSI[6] * *(int *)((long)in_RSI + 0x34);
  local_198 = &local_3b8;
  local_13c = *(int *)((long)in_RDX + 0x2c);
  local_140 = (int)in_RDX[6];
  local_144 = *(undefined4 *)((long)in_RDX + 0x34);
  local_370 = (int *)*in_RDX;
  local_158 = in_RDX[2];
  local_15c = (undefined4)in_RDX[3];
  local_168 = in_RDX[4];
  local_138 = &local_3b8;
  local_8 = (long)local_13c * (long)local_140 * local_158;
  local_170 = &local_3b8;
  local_348 = &local_3b8;
  local_c = 0x10;
  local_1a4 = 0;
  local_1a5 = 1;
  local_3b8 = 0;
  local_3a8 = 0;
  local_3a0 = 0;
  local_390 = 0;
  local_38c = 0;
  local_388 = 0;
  local_384 = 0;
  local_380 = 0;
  local_378 = 0;
  local_3b0 = 0;
  local_350 = in_RDI;
  local_2d8 = local_348;
  local_150 = local_370;
  local_398 = local_168;
  if (in_ECX == 0) {
    local_358 = in_RSI;
    for (local_3c0 = 0; local_3c0 < (int)local_358[7]; local_3c0 = local_3c0 + 1) {
      local_1f0 = &local_410;
      local_104 = *(int *)((long)local_358 + 0x2c);
      local_108 = (int)local_358[6];
      local_10c = *(undefined4 *)((long)local_358 + 0x34);
      local_3c8 = (float *)(*local_358 + local_358[8] * (long)local_3c0 * local_358[2]);
      local_120 = local_358[2];
      local_124 = (undefined4)local_358[3];
      local_130 = local_358[4];
      local_100 = &local_410;
      local_18 = (long)local_104 * (long)local_108 * local_120;
      local_1b0 = &local_410;
      local_340 = &local_410;
      local_1c = 0x10;
      local_1fc = local_3c0;
      local_1fd = 1;
      local_410 = 0;
      local_400 = 0;
      local_3f8 = 0;
      local_3e8 = 0;
      local_3e4 = 0;
      local_3e0 = 0;
      local_3dc = 0;
      local_3d8 = 0;
      local_3d0 = 0;
      local_408 = 0;
      local_2e8 = local_340;
      local_118 = local_3c8;
      local_3f0 = local_130;
      for (local_414 = 0; local_414 < local_368; local_414 = local_414 + 3) {
        local_418 = *local_3c8;
        local_41c = local_3c8[1];
        local_420 = local_3c8[2];
        local_418 = grid_sample_unormalize<false>::operator()
                              (&local_3b9,*(int *)(local_350 + 0x2c),local_418);
        local_418 = compute_coord<(ncnn::GridSample::PaddingMode)1,_false>::operator()
                              (&local_3ba,*(int *)(local_350 + 0x2c),local_418);
        local_41c = grid_sample_unormalize<false>::operator()
                              (&local_3b9,*(int *)(local_350 + 0x30),local_41c);
        local_41c = compute_coord<(ncnn::GridSample::PaddingMode)1,_false>::operator()
                              (&local_3ba,*(int *)(local_350 + 0x30),local_41c);
        local_420 = grid_sample_unormalize<false>::operator()
                              (&local_3b9,*(int *)(local_350 + 0x34),local_420);
        local_420 = compute_coord<(ncnn::GridSample::PaddingMode)1,_false>::operator()
                              (&local_3ba,*(int *)(local_350 + 0x34),local_420);
        fVar19 = floorf(local_418);
        local_424 = (uint)fVar19;
        fVar19 = floorf(local_41c);
        local_428 = (uint)fVar19;
        fVar19 = floorf(local_420);
        local_42c = (uint)fVar19;
        local_430 = local_424 + 1;
        local_434 = local_428 + 1;
        local_438 = local_42c + 1;
        bVar7 = local_424 < 0x80000000;
        bVar1 = (int)local_424 < *(int *)(local_350 + 0x2c);
        local_439 = bVar7 && bVar1;
        bVar8 = local_428 < 0x80000000;
        bVar2 = (int)local_428 < *(int *)(local_350 + 0x30);
        local_43a = bVar8 && bVar2;
        bVar9 = local_42c < 0x80000000;
        bVar3 = (int)local_42c < *(int *)(local_350 + 0x34);
        local_43b = bVar9 && bVar3;
        bVar10 = local_430 < 0x80000000;
        bVar4 = (int)local_430 < *(int *)(local_350 + 0x2c);
        local_43c = bVar10 && bVar4;
        bVar11 = local_434 < 0x80000000;
        bVar5 = (int)local_434 < *(int *)(local_350 + 0x30);
        local_43d = bVar11 && bVar5;
        bVar12 = local_438 < 0x80000000;
        bVar6 = (int)local_438 < *(int *)(local_350 + 0x34);
        local_43e = bVar12 && bVar6;
        local_43f = (bool)local_439 && (bool)local_43a;
        local_440 = (bool)local_43c && (bool)local_43a;
        local_441 = (bool)local_439 && (bool)local_43d;
        local_442 = (bool)local_43c && (bool)local_43d;
        local_443 = (bool)local_43f && (bool)local_43b;
        local_444 = (bool)local_440 && (bool)local_43b;
        local_445 = (bool)local_441 && (bool)local_43b;
        local_446 = (bool)local_442 && (bool)local_43b;
        local_447 = (bool)local_43f && (bool)local_43e;
        local_448 = (bool)local_440 && (bool)local_43e;
        local_449 = (bool)local_441 && (bool)local_43e;
        local_44a = (bool)local_442 && (bool)local_43e;
        local_458 = local_370;
        local_460 = (float *)(local_370 + 8);
        if (((bVar7 && bVar1) && (bVar8 && bVar2)) && (bVar9 && bVar3)) {
          local_5f8 = (double)(int)((local_424 + local_428 * *(int *)(local_350 + 0x2c) +
                                    local_42c * *(int *)(local_350 + 0x2c) *
                                    *(int *)(local_350 + 0x30)) * *(int *)(local_350 + 0x18));
        }
        else {
          local_5f8 = -1.0;
        }
        *local_370 = (int)local_5f8;
        if (((bVar10 && bVar4) && (bVar8 && bVar2)) && (bVar9 && bVar3)) {
          local_600 = (double)(int)((local_430 + local_428 * *(int *)(local_350 + 0x2c) +
                                    local_42c * *(int *)(local_350 + 0x2c) *
                                    *(int *)(local_350 + 0x30)) * *(int *)(local_350 + 0x18));
        }
        else {
          local_600 = -1.0;
        }
        local_370[1] = (int)local_600;
        if (((bVar7 && bVar1) && (bVar11 && bVar5)) && (bVar9 && bVar3)) {
          local_608 = (double)(int)((local_424 + local_434 * *(int *)(local_350 + 0x2c) +
                                    local_42c * *(int *)(local_350 + 0x2c) *
                                    *(int *)(local_350 + 0x30)) * *(int *)(local_350 + 0x18));
        }
        else {
          local_608 = -1.0;
        }
        local_370[2] = (int)local_608;
        if (((bVar10 && bVar4) && (bVar11 && bVar5)) && (bVar9 && bVar3)) {
          local_610 = (double)(int)((local_430 + local_434 * *(int *)(local_350 + 0x2c) +
                                    local_42c * *(int *)(local_350 + 0x2c) *
                                    *(int *)(local_350 + 0x30)) * *(int *)(local_350 + 0x18));
        }
        else {
          local_610 = -1.0;
        }
        local_370[3] = (int)local_610;
        if (((bVar7 && bVar1) && (bVar8 && bVar2)) && (bVar12 && bVar6)) {
          local_618 = (double)(int)((local_424 + local_428 * *(int *)(local_350 + 0x2c) +
                                    local_438 * *(int *)(local_350 + 0x2c) *
                                    *(int *)(local_350 + 0x30)) * *(int *)(local_350 + 0x18));
        }
        else {
          local_618 = -1.0;
        }
        local_370[4] = (int)local_618;
        if (((bVar10 && bVar4) && (bVar8 && bVar2)) && (bVar12 && bVar6)) {
          local_620 = (double)(int)((local_430 + local_428 * *(int *)(local_350 + 0x2c) +
                                    local_438 * *(int *)(local_350 + 0x2c) *
                                    *(int *)(local_350 + 0x30)) * *(int *)(local_350 + 0x18));
        }
        else {
          local_620 = -1.0;
        }
        local_370[5] = (int)local_620;
        if (((bVar7 && bVar1) && (bVar11 && bVar5)) && (bVar12 && bVar6)) {
          local_628 = (double)(int)((local_424 + local_434 * *(int *)(local_350 + 0x2c) +
                                    local_438 * *(int *)(local_350 + 0x2c) *
                                    *(int *)(local_350 + 0x30)) * *(int *)(local_350 + 0x18));
        }
        else {
          local_628 = -1.0;
        }
        local_370[6] = (int)local_628;
        if (((bVar10 && bVar4) && (bVar11 && bVar5)) && (bVar12 && bVar6)) {
          local_630 = (double)(int)((local_430 + local_434 * *(int *)(local_350 + 0x2c) +
                                    local_438 * *(int *)(local_350 + 0x2c) *
                                    *(int *)(local_350 + 0x30)) * *(int *)(local_350 + 0x18));
        }
        else {
          local_630 = -1.0;
        }
        local_370[7] = (int)local_630;
        *local_460 = local_418 - (float)(int)local_424;
        local_370[9] = (int)(local_41c - (float)(int)local_428);
        local_370[10] = (int)(local_420 - (float)(int)local_42c);
        local_3c8 = local_3c8 + 3;
        local_370 = local_370 + 0xb;
      }
    }
  }
  else {
    local_228 = &local_4b0;
    local_cc = *(int *)((long)in_RSI + 0x2c);
    local_d0 = (int)in_RSI[6];
    local_d4 = *(undefined4 *)((long)in_RSI + 0x34);
    local_468 = (float *)*in_RSI;
    local_e8 = in_RSI[2];
    local_ec = (undefined4)in_RSI[3];
    local_f8 = in_RSI[4];
    local_c8 = &local_4b0;
    local_28 = (long)local_cc * (long)local_d0 * local_e8;
    local_1b8 = &local_4b0;
    local_338 = &local_4b0;
    local_260 = &local_500;
    local_94 = *(int *)((long)in_RSI + 0x2c);
    local_98 = (int)in_RSI[6];
    local_9c = *(undefined4 *)((long)in_RSI + 0x34);
    local_4b8 = (float *)(*in_RSI + in_RSI[8] * in_RSI[2]);
    local_b0 = in_RSI[2];
    local_b4 = (undefined4)in_RSI[3];
    local_c0 = in_RSI[4];
    local_90 = &local_500;
    local_38 = (long)local_94 * (long)local_98 * local_b0;
    local_1c0 = &local_500;
    local_330 = &local_500;
    local_298 = &local_550;
    local_5c = *(int *)((long)in_RSI + 0x2c);
    local_60 = (int)in_RSI[6];
    local_64 = *(undefined4 *)((long)in_RSI + 0x34);
    local_508 = (float *)(*in_RSI + in_RSI[8] * 2 * in_RSI[2]);
    local_78 = in_RSI[2];
    local_7c = (undefined4)in_RSI[3];
    local_88 = in_RSI[4];
    local_58 = &local_550;
    local_48 = (long)local_5c * (long)local_60 * local_78;
    local_1c8 = &local_550;
    local_328 = &local_550;
    local_380 = 0;
    local_384 = 0;
    local_388 = 0;
    local_38c = 0;
    local_3a0 = 0;
    local_3a8 = 0;
    local_3b0 = 0;
    local_3b8 = 0;
    local_478 = 0;
    local_47c = 0;
    local_480 = 0;
    local_484 = 0;
    local_498 = 0;
    local_4a0 = 0;
    local_4a8 = 0;
    local_4b0 = 0;
    local_4c8 = 0;
    local_4cc = 0;
    local_4d0 = 0;
    local_4d4 = 0;
    local_4e8 = 0;
    local_4f0 = 0;
    local_4f8 = 0;
    local_500 = 0;
    local_c = 0x10;
    local_2c = 0x10;
    local_3c = 0x10;
    local_4c = 0x10;
    local_1a4 = 0;
    local_1a5 = 1;
    local_234 = 0;
    local_235 = 1;
    local_26c = 1;
    local_26d = 1;
    local_2a4 = 2;
    local_2a5 = 1;
    local_378 = 0;
    local_390 = 0;
    local_470 = 0;
    local_488 = 0;
    local_4c0 = 0;
    local_4d8 = 0;
    local_550 = 0;
    local_540 = 0;
    local_538 = 0;
    local_528 = 0;
    local_524 = 0;
    local_520 = 0;
    local_51c = 0;
    local_518 = 0;
    local_510 = 0;
    local_548 = 0;
    local_318 = local_328;
    local_308 = local_330;
    local_2f8 = local_338;
    local_e0 = local_468;
    local_a8 = local_4b8;
    local_70 = local_508;
    local_530 = local_88;
    local_4e0 = local_c0;
    local_490 = local_f8;
    for (local_554 = 0; local_554 < local_368; local_554 = local_554 + 1) {
      fVar19 = *local_4b8;
      fVar21 = *local_508;
      fVar20 = grid_sample_unormalize<false>::operator()
                         (&local_3b9,*(int *)(local_350 + 0x2c),*local_468);
      fVar20 = compute_coord<(ncnn::GridSample::PaddingMode)1,_false>::operator()
                         (&local_3ba,*(int *)(local_350 + 0x2c),fVar20);
      fVar19 = grid_sample_unormalize<false>::operator()
                         (&local_3b9,*(int *)(local_350 + 0x30),fVar19);
      fVar19 = compute_coord<(ncnn::GridSample::PaddingMode)1,_false>::operator()
                         (&local_3ba,*(int *)(local_350 + 0x30),fVar19);
      fVar21 = grid_sample_unormalize<false>::operator()
                         (&local_3b9,*(int *)(local_350 + 0x34),fVar21);
      fVar21 = compute_coord<(ncnn::GridSample::PaddingMode)1,_false>::operator()
                         (&local_3ba,*(int *)(local_350 + 0x34),fVar21);
      fVar22 = floorf(fVar20);
      uVar13 = (uint)fVar22;
      fVar22 = floorf(fVar19);
      uVar14 = (uint)fVar22;
      fVar22 = floorf(fVar21);
      uVar15 = (uint)fVar22;
      uVar16 = uVar13 + 1;
      uVar17 = uVar14 + 1;
      uVar18 = uVar15 + 1;
      bVar7 = 0x7fffffff < uVar13;
      bVar1 = *(int *)(local_350 + 0x2c) <= (int)uVar13;
      bVar8 = 0x7fffffff < uVar14;
      bVar2 = *(int *)(local_350 + 0x30) <= (int)uVar14;
      bVar9 = 0x7fffffff < uVar15;
      bVar3 = *(int *)(local_350 + 0x34) <= (int)uVar15;
      bVar10 = 0x7fffffff < uVar16;
      bVar4 = *(int *)(local_350 + 0x2c) <= (int)uVar16;
      bVar11 = 0x7fffffff < uVar17;
      bVar5 = *(int *)(local_350 + 0x30) <= (int)uVar17;
      bVar12 = 0x7fffffff < uVar18;
      bVar6 = *(int *)(local_350 + 0x34) <= (int)uVar18;
      if (((bVar7 || bVar1) || (bVar8 || bVar2)) || (bVar9 || bVar3)) {
        local_6b0 = -1.0;
      }
      else {
        local_6b0 = (double)(int)((uVar13 + uVar14 * *(int *)(local_350 + 0x2c) +
                                  uVar15 * *(int *)(local_350 + 0x2c) * *(int *)(local_350 + 0x30))
                                 * *(int *)(local_350 + 0x18));
      }
      *local_370 = (int)local_6b0;
      if (((bVar10 || bVar4) || (bVar8 || bVar2)) || (bVar9 || bVar3)) {
        local_6b8 = -1.0;
      }
      else {
        local_6b8 = (double)(int)((uVar16 + uVar14 * *(int *)(local_350 + 0x2c) +
                                  uVar15 * *(int *)(local_350 + 0x2c) * *(int *)(local_350 + 0x30))
                                 * *(int *)(local_350 + 0x18));
      }
      local_370[1] = (int)local_6b8;
      if (((bVar7 || bVar1) || (bVar11 || bVar5)) || (bVar9 || bVar3)) {
        local_6c0 = -1.0;
      }
      else {
        local_6c0 = (double)(int)((uVar13 + uVar17 * *(int *)(local_350 + 0x2c) +
                                  uVar15 * *(int *)(local_350 + 0x2c) * *(int *)(local_350 + 0x30))
                                 * *(int *)(local_350 + 0x18));
      }
      local_370[2] = (int)local_6c0;
      if (((bVar10 || bVar4) || (bVar11 || bVar5)) || (bVar9 || bVar3)) {
        local_6c8 = -1.0;
      }
      else {
        local_6c8 = (double)(int)((uVar16 + uVar17 * *(int *)(local_350 + 0x2c) +
                                  uVar15 * *(int *)(local_350 + 0x2c) * *(int *)(local_350 + 0x30))
                                 * *(int *)(local_350 + 0x18));
      }
      local_370[3] = (int)local_6c8;
      if (((bVar7 || bVar1) || (bVar8 || bVar2)) || (bVar12 || bVar6)) {
        local_6d0 = -1.0;
      }
      else {
        local_6d0 = (double)(int)((uVar13 + uVar14 * *(int *)(local_350 + 0x2c) +
                                  uVar18 * *(int *)(local_350 + 0x2c) * *(int *)(local_350 + 0x30))
                                 * *(int *)(local_350 + 0x18));
      }
      local_370[4] = (int)local_6d0;
      if (((bVar10 || bVar4) || (bVar8 || bVar2)) || (bVar12 || bVar6)) {
        local_6d8 = -1.0;
      }
      else {
        local_6d8 = (double)(int)((uVar16 + uVar14 * *(int *)(local_350 + 0x2c) +
                                  uVar18 * *(int *)(local_350 + 0x2c) * *(int *)(local_350 + 0x30))
                                 * *(int *)(local_350 + 0x18));
      }
      local_370[5] = (int)local_6d8;
      if (((bVar7 || bVar1) || (bVar11 || bVar5)) || (bVar12 || bVar6)) {
        local_6e0 = -1.0;
      }
      else {
        local_6e0 = (double)(int)((uVar13 + uVar17 * *(int *)(local_350 + 0x2c) +
                                  uVar18 * *(int *)(local_350 + 0x2c) * *(int *)(local_350 + 0x30))
                                 * *(int *)(local_350 + 0x18));
      }
      local_370[6] = (int)local_6e0;
      if (((bVar10 || bVar4) || (bVar11 || bVar5)) || (bVar12 || bVar6)) {
        local_6e8 = -1.0;
      }
      else {
        local_6e8 = (double)(int)((uVar16 + uVar17 * *(int *)(local_350 + 0x2c) +
                                  uVar18 * *(int *)(local_350 + 0x2c) * *(int *)(local_350 + 0x30))
                                 * *(int *)(local_350 + 0x18));
      }
      local_370[7] = (int)local_6e8;
      local_370[8] = (int)(fVar20 - (float)(int)uVar13);
      local_370[9] = (int)(fVar19 - (float)(int)uVar14);
      local_370[10] = (int)(fVar21 - (float)(int)uVar15);
      local_468 = local_468 + 1;
      local_4b8 = local_4b8 + 1;
      local_508 = local_508 + 1;
      local_370 = local_370 + 0xb;
    }
  }
  return;
}

Assistant:

void gridsample_3d_bilinear_compute_blob(const Mat& src, const Mat& grid, Mat& offset_value, int permute_fusion)
{
    const int grid_size = grid.w * grid.h * grid.d;

    float* offset_value_ptr = offset_value.channel(0);

    grid_sample_unormalize<align_corner> unormalize;
    compute_coord<pd, align_corner> get_coord;

    if (permute_fusion == 0)
    {
        for (int y = 0; y < grid.c; y++)
        {
            const float* gridptr = grid.channel(y);
            int x = 0;
#if __AVX__
            for (; x + 23 < grid_size; x += 24)
            {
                __m256 gx = _mm256_loadu_ps(gridptr);
                __m256 gy = _mm256_loadu_ps(gridptr + 8);
                __m256 gz = _mm256_loadu_ps(gridptr + 16);

                transpose3x8_ps(gx, gy, gz);

                gx = unormalize(_mm256_set1_ps(src.w), gx);
                gx = get_coord(_mm256_set1_ps(src.w), gx);

                gy = unormalize(_mm256_set1_ps(src.h), gy);
                gy = get_coord(_mm256_set1_ps(src.h), gy);

                gz = unormalize(_mm256_set1_ps(src.d), gz);
                gz = get_coord(_mm256_set1_ps(src.d), gz);

                __m256 x_w = _mm256_floor_ps(gx);
                __m256 y_n = _mm256_floor_ps(gy);
                __m256 z_t = _mm256_floor_ps(gz);

                __m256 x1 = _mm256_add_ps(x_w, _mm256_set1_ps(1));
                __m256 y1 = _mm256_add_ps(y_n, _mm256_set1_ps(1));
                __m256 z1 = _mm256_add_ps(z_t, _mm256_set1_ps(1));

                __m256 x0_in_range = _mm256_and_ps(_mm256_cmp_ps(x_w, _mm256_set1_ps(-1), _CMP_GT_OS), _mm256_cmp_ps(_mm256_set1_ps(src.w), x_w, _CMP_GT_OS));
                __m256 x1_in_range = _mm256_and_ps(_mm256_cmp_ps(x1, _mm256_set1_ps(-1), _CMP_GT_OS), _mm256_cmp_ps(_mm256_set1_ps(src.w), x1, _CMP_GT_OS));
                __m256 y0_in_range = _mm256_and_ps(_mm256_cmp_ps(y_n, _mm256_set1_ps(-1), _CMP_GT_OS), _mm256_cmp_ps(_mm256_set1_ps(src.h), y_n, _CMP_GT_OS));
                __m256 y1_in_range = _mm256_and_ps(_mm256_cmp_ps(y1, _mm256_set1_ps(-1), _CMP_GT_OS), _mm256_cmp_ps(_mm256_set1_ps(src.h), y1, _CMP_GT_OS));
                __m256 z0_in_range = _mm256_and_ps(_mm256_cmp_ps(z_t, _mm256_set1_ps(-1), _CMP_GT_OS), _mm256_cmp_ps(_mm256_set1_ps(src.d), z_t, _CMP_GT_OS));
                __m256 z1_in_range = _mm256_and_ps(_mm256_cmp_ps(z1, _mm256_set1_ps(-1), _CMP_GT_OS), _mm256_cmp_ps(_mm256_set1_ps(src.d), z1, _CMP_GT_OS));

                __m256 v000_in_range, v010_in_range, v100_in_range, v110_in_range, v001_in_range, v011_in_range, v101_in_range, v111_in_range;
                {
                    __m256 v00_in_range = _mm256_and_ps(x0_in_range, y0_in_range);
                    __m256 v01_in_range = _mm256_and_ps(x1_in_range, y0_in_range);
                    __m256 v10_in_range = _mm256_and_ps(x0_in_range, y1_in_range);
                    __m256 v11_in_range = _mm256_and_ps(x1_in_range, y1_in_range);

                    v000_in_range = _mm256_and_ps(v00_in_range, z0_in_range);
                    v001_in_range = _mm256_and_ps(v01_in_range, z0_in_range);
                    v010_in_range = _mm256_and_ps(v10_in_range, z0_in_range);
                    v011_in_range = _mm256_and_ps(v11_in_range, z0_in_range);

                    v100_in_range = _mm256_and_ps(v00_in_range, z1_in_range);
                    v101_in_range = _mm256_and_ps(v01_in_range, z1_in_range);
                    v110_in_range = _mm256_and_ps(v10_in_range, z1_in_range);
                    v111_in_range = _mm256_and_ps(v11_in_range, z1_in_range);
                }

                __m256 tnw_offset = _mm256_mul_ps(_mm256_comp_fmadd_ps(_mm256_mul_ps(_mm256_set1_ps(src.w), _mm256_set1_ps(src.h)), z_t,
                                                  _mm256_comp_fmadd_ps(y_n, _mm256_set1_ps(src.w), x_w)),
                                                  _mm256_set1_ps(src.elempack));
                __m256 tne_offset = _mm256_add_ps(tnw_offset, _mm256_set1_ps(src.elempack));
                __m256 tsw_offset = _mm256_add_ps(tnw_offset, _mm256_mul_ps(_mm256_set1_ps(src.w), _mm256_set1_ps(src.elempack)));
                __m256 tse_offset = _mm256_add_ps(tsw_offset, _mm256_set1_ps(src.elempack));

                __m256 bnw_offset = _mm256_comp_fmadd_ps(_mm256_mul_ps(_mm256_set1_ps(src.w), _mm256_set1_ps(src.h)), _mm256_set1_ps(src.elempack), tnw_offset);
                __m256 bne_offset = _mm256_add_ps(bnw_offset, _mm256_set1_ps(src.elempack));
                __m256 bsw_offset = _mm256_add_ps(bnw_offset, _mm256_mul_ps(_mm256_set1_ps(src.w), _mm256_set1_ps(src.elempack)));
                __m256 bse_offset = _mm256_add_ps(bsw_offset, _mm256_set1_ps(src.elempack));

                tnw_offset = _mm256_blendv_ps(_mm256_set1_ps(-1.0f), tnw_offset, v000_in_range);
                tne_offset = _mm256_blendv_ps(_mm256_set1_ps(-1.0f), tne_offset, v001_in_range);
                tsw_offset = _mm256_blendv_ps(_mm256_set1_ps(-1.0f), tsw_offset, v010_in_range);
                tse_offset = _mm256_blendv_ps(_mm256_set1_ps(-1.0f), tse_offset, v011_in_range);

                bnw_offset = _mm256_blendv_ps(_mm256_set1_ps(-1.0f), bnw_offset, v100_in_range);
                bne_offset = _mm256_blendv_ps(_mm256_set1_ps(-1.0f), bne_offset, v101_in_range);
                bsw_offset = _mm256_blendv_ps(_mm256_set1_ps(-1.0f), bsw_offset, v110_in_range);
                bse_offset = _mm256_blendv_ps(_mm256_set1_ps(-1.0f), bse_offset, v111_in_range);

                tnw_offset = _mm256_castsi256_ps(_mm256_cvtps_epi32(tnw_offset));
                tne_offset = _mm256_castsi256_ps(_mm256_cvtps_epi32(tne_offset));
                tsw_offset = _mm256_castsi256_ps(_mm256_cvtps_epi32(tsw_offset));
                tse_offset = _mm256_castsi256_ps(_mm256_cvtps_epi32(tse_offset));

                bnw_offset = _mm256_castsi256_ps(_mm256_cvtps_epi32(bnw_offset));
                bne_offset = _mm256_castsi256_ps(_mm256_cvtps_epi32(bne_offset));
                bsw_offset = _mm256_castsi256_ps(_mm256_cvtps_epi32(bsw_offset));
                bse_offset = _mm256_castsi256_ps(_mm256_cvtps_epi32(bse_offset));

                __m256 alpha = _mm256_sub_ps(gx, x_w);
                __m256 beta = _mm256_sub_ps(gy, y_n);
                __m256 gamma = _mm256_sub_ps(gz, z_t);

                transpose8x11_ps(tnw_offset, tne_offset, tsw_offset, tse_offset, bnw_offset, bne_offset, bsw_offset, bse_offset, alpha, beta, gamma);

                _mm256_storeu_ps(offset_value_ptr, tnw_offset);
                _mm256_storeu_ps(offset_value_ptr + 8, tne_offset);
                _mm256_storeu_ps(offset_value_ptr + 16, tsw_offset);
                _mm256_storeu_ps(offset_value_ptr + 24, tse_offset);

                _mm256_storeu_ps(offset_value_ptr + 32, bnw_offset);
                _mm256_storeu_ps(offset_value_ptr + 40, bne_offset);
                _mm256_storeu_ps(offset_value_ptr + 48, bsw_offset);
                _mm256_storeu_ps(offset_value_ptr + 56, bse_offset);

                _mm256_storeu_ps(offset_value_ptr + 64, alpha);
                _mm256_storeu_ps(offset_value_ptr + 72, beta);
                _mm256_storeu_ps(offset_value_ptr + 80, gamma);

                gridptr += 24;

                offset_value_ptr += 88;
            }
#endif // __AVX__

            for (; x < grid_size; x += 3)
            {
                float sample_x = *gridptr;
                float sample_y = *(gridptr + 1);
                float sample_z = *(gridptr + 2);

                sample_x = unormalize(src.w, sample_x);
                sample_x = get_coord(src.w, sample_x);

                sample_y = unormalize(src.h, sample_y);
                sample_y = get_coord(src.h, sample_y);

                sample_z = unormalize(src.d, sample_z);
                sample_z = get_coord(src.d, sample_z);

                int x0 = (int)floorf(sample_x);
                int y0 = (int)floorf(sample_y);
                int z0 = (int)floorf(sample_z);
                int x1 = x0 + 1;
                int y1 = y0 + 1;
                int z1 = z0 + 1;

                bool x0_in_range = (x0 > -1) & (x0 < src.w);
                bool y0_in_range = (y0 > -1) & (y0 < src.h);
                bool z0_in_range = (z0 > -1) & (z0 < src.d);
                bool x1_in_range = (x1 > -1) & (x1 < src.w);
                bool y1_in_range = (y1 > -1) & (y1 < src.h);
                bool z1_in_range = (z1 > -1) & (z1 < src.d);

                bool v00_in_range = x0_in_range & y0_in_range;
                bool v01_in_range = x1_in_range & y0_in_range;
                bool v10_in_range = x0_in_range & y1_in_range;
                bool v11_in_range = x1_in_range & y1_in_range;

                bool in_bound_000 = v00_in_range & z0_in_range;
                bool in_bound_001 = v01_in_range & z0_in_range;
                bool in_bound_010 = v10_in_range & z0_in_range;
                bool in_bound_011 = v11_in_range & z0_in_range;

                bool in_bound_100 = v00_in_range & z1_in_range;
                bool in_bound_101 = v01_in_range & z1_in_range;
                bool in_bound_110 = v10_in_range & z1_in_range;
                bool in_bound_111 = v11_in_range & z1_in_range;

                int* offset_ptr = (int*)offset_value_ptr;
                float* value_ptr = offset_value_ptr + 8;

                offset_ptr[0] = in_bound_000 ? (x0 + y0 * src.w + z0 * src.w * src.h) * src.elempack : -1.0;
                offset_ptr[1] = in_bound_001 ? (x1 + y0 * src.w + z0 * src.w * src.h) * src.elempack : -1.0;
                offset_ptr[2] = in_bound_010 ? (x0 + y1 * src.w + z0 * src.w * src.h) * src.elempack : -1.0;
                offset_ptr[3] = in_bound_011 ? (x1 + y1 * src.w + z0 * src.w * src.h) * src.elempack : -1.0;

                offset_ptr[4] = in_bound_100 ? (x0 + y0 * src.w + z1 * src.w * src.h) * src.elempack : -1.0;
                offset_ptr[5] = in_bound_101 ? (x1 + y0 * src.w + z1 * src.w * src.h) * src.elempack : -1.0;
                offset_ptr[6] = in_bound_110 ? (x0 + y1 * src.w + z1 * src.w * src.h) * src.elempack : -1.0;
                offset_ptr[7] = in_bound_111 ? (x1 + y1 * src.w + z1 * src.w * src.h) * src.elempack : -1.0;

                value_ptr[0] = sample_x - x0;
                value_ptr[1] = sample_y - y0;
                value_ptr[2] = sample_z - z0;

                gridptr += 3;
                offset_value_ptr += 11;
            }
        }
    }
    else
    {
        const float* gridptr_x = grid.channel(0);
        const float* gridptr_y = grid.channel(1);
        const float* gridptr_z = grid.channel(2);

        int x = 0;
#if __AVX__
        for (; x + 7 < grid_size; x += 8)
        {
            __m256 gx = _mm256_loadu_ps(gridptr_x);
            __m256 gy = _mm256_loadu_ps(gridptr_y);
            __m256 gz = _mm256_loadu_ps(gridptr_z);

            gx = unormalize(_mm256_set1_ps(src.w), gx);
            gx = get_coord(_mm256_set1_ps(src.w), gx);

            gy = unormalize(_mm256_set1_ps(src.h), gy);
            gy = get_coord(_mm256_set1_ps(src.h), gy);

            gz = unormalize(_mm256_set1_ps(src.d), gz);
            gz = get_coord(_mm256_set1_ps(src.d), gz);

            __m256 x_w = _mm256_floor_ps(gx);
            __m256 y_n = _mm256_floor_ps(gy);
            __m256 z_t = _mm256_floor_ps(gz);

            __m256 x1 = _mm256_add_ps(x_w, _mm256_set1_ps(1));
            __m256 y1 = _mm256_add_ps(y_n, _mm256_set1_ps(1));
            __m256 z1 = _mm256_add_ps(z_t, _mm256_set1_ps(1));

            __m256 x0_in_range = _mm256_and_ps(_mm256_cmp_ps(x_w, _mm256_set1_ps(-1), _CMP_GT_OS), _mm256_cmp_ps(_mm256_set1_ps(src.w), x_w, _CMP_GT_OS));
            __m256 x1_in_range = _mm256_and_ps(_mm256_cmp_ps(x1, _mm256_set1_ps(-1), _CMP_GT_OS), _mm256_cmp_ps(_mm256_set1_ps(src.w), x1, _CMP_GT_OS));
            __m256 y0_in_range = _mm256_and_ps(_mm256_cmp_ps(y_n, _mm256_set1_ps(-1), _CMP_GT_OS), _mm256_cmp_ps(_mm256_set1_ps(src.h), y_n, _CMP_GT_OS));
            __m256 y1_in_range = _mm256_and_ps(_mm256_cmp_ps(y1, _mm256_set1_ps(-1), _CMP_GT_OS), _mm256_cmp_ps(_mm256_set1_ps(src.h), y1, _CMP_GT_OS));
            __m256 z0_in_range = _mm256_and_ps(_mm256_cmp_ps(z_t, _mm256_set1_ps(-1), _CMP_GT_OS), _mm256_cmp_ps(_mm256_set1_ps(src.d), z_t, _CMP_GT_OS));
            __m256 z1_in_range = _mm256_and_ps(_mm256_cmp_ps(z1, _mm256_set1_ps(-1), _CMP_GT_OS), _mm256_cmp_ps(_mm256_set1_ps(src.d), z1, _CMP_GT_OS));

            __m256 v000_in_range, v010_in_range, v100_in_range, v110_in_range, v001_in_range, v011_in_range, v101_in_range, v111_in_range;
            {
                __m256 v00_in_range = _mm256_and_ps(x0_in_range, y0_in_range);
                __m256 v01_in_range = _mm256_and_ps(x1_in_range, y0_in_range);
                __m256 v10_in_range = _mm256_and_ps(x0_in_range, y1_in_range);
                __m256 v11_in_range = _mm256_and_ps(x1_in_range, y1_in_range);

                v000_in_range = _mm256_and_ps(v00_in_range, z0_in_range);
                v001_in_range = _mm256_and_ps(v01_in_range, z0_in_range);
                v010_in_range = _mm256_and_ps(v10_in_range, z0_in_range);
                v011_in_range = _mm256_and_ps(v11_in_range, z0_in_range);

                v100_in_range = _mm256_and_ps(v00_in_range, z1_in_range);
                v101_in_range = _mm256_and_ps(v01_in_range, z1_in_range);
                v110_in_range = _mm256_and_ps(v10_in_range, z1_in_range);
                v111_in_range = _mm256_and_ps(v11_in_range, z1_in_range);
            }

            __m256 tnw_offset = _mm256_mul_ps(_mm256_comp_fmadd_ps(_mm256_mul_ps(_mm256_set1_ps(src.w), _mm256_set1_ps(src.h)), z_t,
                                              _mm256_comp_fmadd_ps(y_n, _mm256_set1_ps(src.w), x_w)),
                                              _mm256_set1_ps(src.elempack));
            __m256 tne_offset = _mm256_add_ps(tnw_offset, _mm256_set1_ps(src.elempack));
            __m256 tsw_offset = _mm256_add_ps(tnw_offset, _mm256_mul_ps(_mm256_set1_ps(src.w), _mm256_set1_ps(src.elempack)));
            __m256 tse_offset = _mm256_add_ps(tsw_offset, _mm256_set1_ps(src.elempack));

            __m256 bnw_offset = _mm256_comp_fmadd_ps(_mm256_mul_ps(_mm256_set1_ps(src.w), _mm256_set1_ps(src.h)), _mm256_set1_ps(src.elempack), tnw_offset);
            __m256 bne_offset = _mm256_add_ps(bnw_offset, _mm256_set1_ps(src.elempack));
            __m256 bsw_offset = _mm256_add_ps(bnw_offset, _mm256_mul_ps(_mm256_set1_ps(src.w), _mm256_set1_ps(src.elempack)));
            __m256 bse_offset = _mm256_add_ps(bsw_offset, _mm256_set1_ps(src.elempack));

            tnw_offset = _mm256_blendv_ps(_mm256_set1_ps(-1.0f), tnw_offset, v000_in_range);
            tne_offset = _mm256_blendv_ps(_mm256_set1_ps(-1.0f), tne_offset, v001_in_range);
            tsw_offset = _mm256_blendv_ps(_mm256_set1_ps(-1.0f), tsw_offset, v010_in_range);
            tse_offset = _mm256_blendv_ps(_mm256_set1_ps(-1.0f), tse_offset, v011_in_range);

            bnw_offset = _mm256_blendv_ps(_mm256_set1_ps(-1.0f), bnw_offset, v100_in_range);
            bne_offset = _mm256_blendv_ps(_mm256_set1_ps(-1.0f), bne_offset, v101_in_range);
            bsw_offset = _mm256_blendv_ps(_mm256_set1_ps(-1.0f), bsw_offset, v110_in_range);
            bse_offset = _mm256_blendv_ps(_mm256_set1_ps(-1.0f), bse_offset, v111_in_range);

            tnw_offset = _mm256_castsi256_ps(_mm256_cvtps_epi32(tnw_offset));
            tne_offset = _mm256_castsi256_ps(_mm256_cvtps_epi32(tne_offset));
            tsw_offset = _mm256_castsi256_ps(_mm256_cvtps_epi32(tsw_offset));
            tse_offset = _mm256_castsi256_ps(_mm256_cvtps_epi32(tse_offset));

            bnw_offset = _mm256_castsi256_ps(_mm256_cvtps_epi32(bnw_offset));
            bne_offset = _mm256_castsi256_ps(_mm256_cvtps_epi32(bne_offset));
            bsw_offset = _mm256_castsi256_ps(_mm256_cvtps_epi32(bsw_offset));
            bse_offset = _mm256_castsi256_ps(_mm256_cvtps_epi32(bse_offset));

            __m256 alpha = _mm256_sub_ps(gx, x_w);
            __m256 beta = _mm256_sub_ps(gy, y_n);
            __m256 gamma = _mm256_sub_ps(gz, z_t);

            transpose8x11_ps(tnw_offset, tne_offset, tsw_offset, tse_offset, bnw_offset, bne_offset, bsw_offset, bse_offset, alpha, beta, gamma);

            _mm256_storeu_ps(offset_value_ptr, tnw_offset);
            _mm256_storeu_ps(offset_value_ptr + 8, tne_offset);
            _mm256_storeu_ps(offset_value_ptr + 16, tsw_offset);
            _mm256_storeu_ps(offset_value_ptr + 24, tse_offset);

            _mm256_storeu_ps(offset_value_ptr + 32, bnw_offset);
            _mm256_storeu_ps(offset_value_ptr + 40, bne_offset);
            _mm256_storeu_ps(offset_value_ptr + 48, bsw_offset);
            _mm256_storeu_ps(offset_value_ptr + 56, bse_offset);

            _mm256_storeu_ps(offset_value_ptr + 64, alpha);
            _mm256_storeu_ps(offset_value_ptr + 72, beta);
            _mm256_storeu_ps(offset_value_ptr + 80, gamma);

            gridptr_x += 8;
            gridptr_y += 8;
            gridptr_z += 8;

            offset_value_ptr += 88;
        }
#endif // __AVX__

        for (; x < grid_size; x++)
        {
            float sample_x = *gridptr_x;
            float sample_y = *gridptr_y;
            float sample_z = *gridptr_z;

            sample_x = unormalize(src.w, sample_x);
            sample_x = get_coord(src.w, sample_x);

            sample_y = unormalize(src.h, sample_y);
            sample_y = get_coord(src.h, sample_y);

            sample_z = unormalize(src.d, sample_z);
            sample_z = get_coord(src.d, sample_z);

            int x0 = (int)floorf(sample_x);
            int y0 = (int)floorf(sample_y);
            int z0 = (int)floorf(sample_z);
            int x1 = x0 + 1;
            int y1 = y0 + 1;
            int z1 = z0 + 1;

            bool x0_in_range = (x0 > -1) & (x0 < src.w);
            bool y0_in_range = (y0 > -1) & (y0 < src.h);
            bool z0_in_range = (z0 > -1) & (z0 < src.d);
            bool x1_in_range = (x1 > -1) & (x1 < src.w);
            bool y1_in_range = (y1 > -1) & (y1 < src.h);
            bool z1_in_range = (z1 > -1) & (z1 < src.d);

            bool v00_in_range = x0_in_range & y0_in_range;
            bool v01_in_range = x1_in_range & y0_in_range;
            bool v10_in_range = x0_in_range & y1_in_range;
            bool v11_in_range = x1_in_range & y1_in_range;

            bool in_bound_000 = v00_in_range & z0_in_range;
            bool in_bound_001 = v01_in_range & z0_in_range;
            bool in_bound_010 = v10_in_range & z0_in_range;
            bool in_bound_011 = v11_in_range & z0_in_range;

            bool in_bound_100 = v00_in_range & z1_in_range;
            bool in_bound_101 = v01_in_range & z1_in_range;
            bool in_bound_110 = v10_in_range & z1_in_range;
            bool in_bound_111 = v11_in_range & z1_in_range;

            int* offset_ptr = (int*)offset_value_ptr;
            float* value_ptr = offset_value_ptr + 8;

            offset_ptr[0] = in_bound_000 ? (x0 + y0 * src.w + z0 * src.w * src.h) * src.elempack : -1.0;
            offset_ptr[1] = in_bound_001 ? (x1 + y0 * src.w + z0 * src.w * src.h) * src.elempack : -1.0;
            offset_ptr[2] = in_bound_010 ? (x0 + y1 * src.w + z0 * src.w * src.h) * src.elempack : -1.0;
            offset_ptr[3] = in_bound_011 ? (x1 + y1 * src.w + z0 * src.w * src.h) * src.elempack : -1.0;

            offset_ptr[4] = in_bound_100 ? (x0 + y0 * src.w + z1 * src.w * src.h) * src.elempack : -1.0;
            offset_ptr[5] = in_bound_101 ? (x1 + y0 * src.w + z1 * src.w * src.h) * src.elempack : -1.0;
            offset_ptr[6] = in_bound_110 ? (x0 + y1 * src.w + z1 * src.w * src.h) * src.elempack : -1.0;
            offset_ptr[7] = in_bound_111 ? (x1 + y1 * src.w + z1 * src.w * src.h) * src.elempack : -1.0;

            value_ptr[0] = sample_x - x0;
            value_ptr[1] = sample_y - y0;
            value_ptr[2] = sample_z - z0;

            gridptr_x++;
            gridptr_y++;
            gridptr_z++;
            offset_value_ptr += 11;
        }
    }
}